

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_image_rotate_cw_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  void *__dest;
  void *__src;
  void *pvVar8;
  size_t __n;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    lVar4 = (long)image.height;
    iVar2 = rf_bits_per_pixel(image.format);
    iVar2 = iVar2 * image.height * image.width;
    iVar3 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    if (iVar3 >> 3 <= dst_size) {
      if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        __n = *(size_t *)(&DAT_0017bf58 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
      }
      else {
        __n = 0;
      }
      if (0 < image.height) {
        pvVar7 = (void *)((lVar4 + -1) * __n + (long)dst);
        lVar6 = 0;
        pvVar8 = image.data;
        do {
          lVar5 = (long)image.width;
          __dest = pvVar7;
          __src = pvVar8;
          if (0 < image.width) {
            do {
              memcpy(__dest,__src,__n);
              __src = (void *)((long)__src + __n);
              __dest = (void *)((long)__dest + __n * lVar4);
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          lVar6 = lVar6 + 1;
          pvVar8 = (void *)((long)pvVar8 + __n * (long)image.width);
          pvVar7 = (void *)((long)pvVar7 - __n);
        } while (lVar6 != lVar4);
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = (int)image._8_8_;
      __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      __return_storage_ptr__->format = (int)uVar1;
      __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_rotate_cw_to_buffer(rf_image image, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    void* dst_pixel = ((unsigned char*)dst) + (x * image.height + (image.height - y - 1)) * bpp;
                    void* src_pixel = ((unsigned char*)image.data) + (y * image.width + x) * bpp;

                    memcpy(dst_pixel, src_pixel, bpp);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}